

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_reporting.cc
# Opt level: O1

void gflags::HandleCommandLineHelpFlags(void)

{
  string *filename;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  char *prog_name;
  long *plVar4;
  size_t sVar5;
  ulong *puVar6;
  size_type *psVar7;
  undefined4 uVar8;
  pointer pCVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string r;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  substrings;
  vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_> flags;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  ulong *local_a8;
  size_t local_a0;
  ulong local_98;
  long lStack_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_> local_68;
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  prog_name = ProgramInvocationShortName();
  HandleCommandLineCompletions();
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0 = 0;
  local_98 = local_98 & 0xffffffffffffff00;
  local_a8 = &local_98;
  std::__cxx11::string::push_back((char)&local_a8);
  std::__cxx11::string::append((char *)&local_a8);
  paVar1 = &local_c8.field_2;
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_c8,local_a8,(long)local_a8 + local_a0);
  std::__cxx11::string::append((char *)&local_c8);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
             &local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_c8,local_a8,(long)local_a8 + local_a0);
  std::__cxx11::string::append((char *)&local_c8);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
             &local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_c8,local_a8,(long)local_a8 + local_a0);
  std::__cxx11::string::append((char *)&local_c8);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
             &local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  if (fLB::FLAGS_helpshort == '\x01') {
    uVar8 = 1;
    ShowUsageWithFlagsMatching(prog_name,&local_88);
  }
  else if ((fLB::FLAGS_help == '\0') && (fLB::FLAGS_helpfull != '\x01')) {
    if (fLS::FLAGS_helpon_abi_cxx11_->_M_string_length != 0) {
      std::operator+(&local_c8,'/',fLS::FLAGS_helpon_abi_cxx11_);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_c8);
      puVar6 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar6) {
        local_98 = *puVar6;
        lStack_90 = plVar4[3];
        local_a8 = &local_98;
      }
      else {
        local_98 = *puVar6;
        local_a8 = (ulong *)*plVar4;
      }
      local_a0 = plVar4[1];
      *plVar4 = (long)puVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      ShowUsageWithFlagsRestrict(prog_name,(char *)local_a8);
      (*(code *)gflags_exitfunc)(1);
      return;
    }
    if (fLS::FLAGS_helpmatch_abi_cxx11_[1] == 0) {
      if (fLB::FLAGS_helppackage == '\x01') {
        local_68.
        super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.
        super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_68.
        super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        GetAllFlags(&local_68);
        local_a0 = 0;
        local_98 = local_98 & 0xffffffffffffff00;
        local_a8 = &local_98;
        if (local_68.
            super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_68.
            super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pCVar9 = local_68.
                   super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          do {
            filename = &pCVar9->filename;
            bVar2 = FileMatchesSubstring(filename,&local_88);
            if (bVar2) {
              std::__cxx11::string::rfind((char)filename,0x2f);
              std::__cxx11::string::substr((ulong)&local_50,(ulong)filename);
              plVar4 = (long *)std::__cxx11::string::_M_replace_aux
                                         ((ulong)&local_50,local_48,0,'\x01');
              psVar7 = (size_type *)(plVar4 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar4 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar7) {
                local_c8.field_2._M_allocated_capacity = *psVar7;
                local_c8.field_2._8_8_ = plVar4[3];
                local_c8._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_c8.field_2._M_allocated_capacity = *psVar7;
                local_c8._M_dataplus._M_p = (pointer)*plVar4;
              }
              local_c8._M_string_length = plVar4[1];
              *plVar4 = (long)psVar7;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              if (local_50 != local_40) {
                operator_delete(local_50,local_40[0] + 1);
              }
              if ((local_c8._M_string_length != local_a0) ||
                 ((local_c8._M_string_length != 0 &&
                  (iVar3 = bcmp(local_c8._M_dataplus._M_p,local_a8,local_c8._M_string_length),
                  iVar3 != 0)))) {
                ShowUsageWithFlagsRestrict(prog_name,local_c8._M_dataplus._M_p);
                if (local_a0 != 0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"Multiple packages contain a file=",0x21);
                  if (prog_name == (char *)0x0) {
                    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x13a420);
                  }
                  else {
                    sVar5 = strlen(prog_name);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,prog_name,sVar5);
                  }
                }
                std::__cxx11::string::_M_assign((string *)&local_a8);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != paVar1) {
                operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1
                               );
              }
            }
            pCVar9 = pCVar9 + 1;
          } while (pCVar9 != local_68.
                             super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
        }
        if (local_a0 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Unable to find a package for file=",0x22);
          std::operator<<((ostream *)&std::cerr,prog_name);
        }
        (*(code *)gflags_exitfunc)(1);
        return;
      }
      if (fLB::FLAGS_helpxml == '\x01') {
        uVar8 = 1;
        ShowXMLOfFlags(prog_name);
      }
      else {
        if (fLB::FLAGS_version != '\x01') {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_88);
          return;
        }
        uVar8 = 0;
        ShowVersion();
      }
    }
    else {
      uVar8 = 1;
      ShowUsageWithFlagsRestrict(prog_name,(char *)*fLS::FLAGS_helpmatch_abi_cxx11_);
    }
  }
  else {
    uVar8 = 1;
    ShowUsageWithFlagsRestrict(prog_name,"");
  }
  (*(code *)gflags_exitfunc)(uVar8);
  return;
}

Assistant:

void HandleCommandLineHelpFlags() {
  const char* progname = ProgramInvocationShortName();

  HandleCommandLineCompletions();

  vector<string> substrings;
  AppendPrognameStrings(&substrings, progname);

  if (FLAGS_helpshort) {
    // show only flags related to this binary:
    // E.g. for fileutil.cc, want flags containing   ... "/fileutil." cc
    ShowUsageWithFlagsMatching(progname, substrings);
    gflags_exitfunc(1);

  } else if (FLAGS_help || FLAGS_helpfull) {
    // show all options
    ShowUsageWithFlagsRestrict(progname, "");   // empty restrict
    gflags_exitfunc(1);

  } else if (!FLAGS_helpon.empty()) {
    string restrict_ = PATH_SEPARATOR + FLAGS_helpon + ".";
    ShowUsageWithFlagsRestrict(progname, restrict_.c_str());
    gflags_exitfunc(1);

  } else if (!FLAGS_helpmatch.empty()) {
    ShowUsageWithFlagsRestrict(progname, FLAGS_helpmatch.c_str());
    gflags_exitfunc(1);

  } else if (FLAGS_helppackage) {
    // Shows help for all files in the same directory as main().  We
    // don't want to resort to looking at dirname(progname), because
    // the user can pick progname, and it may not relate to the file
    // where main() resides.  So instead, we search the flags for a
    // filename like "/progname.cc", and take the dirname of that.
    vector<CommandLineFlagInfo> flags;
    GetAllFlags(&flags);
    string last_package;
    for (vector<CommandLineFlagInfo>::const_iterator flag = flags.begin();
         flag != flags.end();
         ++flag) {
      if (!FileMatchesSubstring(flag->filename, substrings))
        continue;
      const string package = Dirname(flag->filename) + PATH_SEPARATOR;
      if (package != last_package) {
        ShowUsageWithFlagsRestrict(progname, package.c_str());
        VLOG(7) << "Found package: " << package;
        if (!last_package.empty()) {      // means this isn't our first pkg
          LOG(WARNING) << "Multiple packages contain a file=" << progname;
        }
        last_package = package;
      }
    }
    if (last_package.empty()) {   // never found a package to print
      LOG(WARNING) << "Unable to find a package for file=" << progname;
    }
    gflags_exitfunc(1);

  } else if (FLAGS_helpxml) {
    ShowXMLOfFlags(progname);
    gflags_exitfunc(1);

  } else if (FLAGS_version) {
    ShowVersion();
    // Unlike help, we may be asking for version in a script, so return 0
    gflags_exitfunc(0);

  }
}